

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CPToken cp_next(CPState *cp)

{
  SBuf *sb;
  CPChar CVar1;
  uint8_t *p;
  byte *pbVar2;
  TValue *pTVar3;
  lua_State *L;
  double dVar4;
  byte bVar5;
  uint uVar6;
  CTypeID CVar7;
  StrScanFmt SVar8;
  uint uVar9;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar10;
  char *pcVar11;
  GCstr *pGVar12;
  int iVar13;
  ulong uVar14;
  ErrMsg em;
  long lVar15;
  char cVar16;
  uint uVar17;
  int iVar18;
  TValue local_38;
  
  sb = &cp->sb;
  (cp->sb).w = (cp->sb).b;
  lVar15 = (long)cp->c;
  bVar5 = ""[lVar15 + 1];
  if (-1 < (char)bVar5) {
LAB_0014ec2e:
    uVar6 = (uint)lVar15;
    if ((int)uVar6 < 0xd) {
      if (((int)uVar6 < 0xb) && (uVar6 != 9)) {
        if (uVar6 != 10) {
          uVar17 = 0x103;
          if (uVar6 != 0) goto switchD_0014ec75_caseD_23;
          goto LAB_0014f097;
        }
LAB_0014ed26:
        bVar5 = *cp->p;
        if (((bVar5 == 0xd) || (bVar5 == 10)) && (uVar6 != bVar5)) {
          cp->p = cp->p + 1;
        }
        cp->linenumber = cp->linenumber + 1;
      }
switchD_0014ec75_caseD_20:
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      uVar6 = (uint)*pbVar2;
      cp->c = uVar6;
      if (uVar6 == 0x5c) {
        cp_get_bs(cp);
      }
      goto LAB_0014ed5c;
    }
    if ((int)uVar6 < 0x3c) {
      switch(uVar6) {
      case 0x20:
        goto switchD_0014ec75_caseD_20;
      case 0x21:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        uVar17 = 0x21;
        if (uVar6 != 0x3d) goto LAB_0014f097;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar6 = (uint)*pbVar2;
        cp->c = uVar6;
        uVar17 = 0x107;
        break;
      case 0x22:
      case 0x27:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar17 = (uint)*pbVar2;
        cp->c = uVar17;
        if (uVar17 == 0x5c) {
          cp_get_bs(cp);
        }
        uVar17 = cp->c;
        goto joined_r0x0014f0f4;
      case 0x23:
      case 0x25:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2e:
        goto switchD_0014ec75_caseD_23;
      case 0x24:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        if ((uVar6 == 0x24) || ((char)""[(long)(int)uVar6 + 1] < '\0')) {
          em = LJ_ERR_XSYNTAX;
          goto LAB_0014f698;
        }
        pTVar3 = cp->param;
        if ((pTVar3 == (TValue *)0x0) || (L = cp->L, L->top <= pTVar3)) {
          cp_err(cp,LJ_ERR_FFI_NUMPARAM);
        }
        cp->param = pTVar3 + 1;
        dVar4 = (double)pTVar3->u64;
        uVar14 = (long)dVar4 >> 0x2f;
        if (uVar14 == 0xfffffffffffffffb) {
          cp->str = (GCstr *)((ulong)dVar4 & 0x7fffffffffff);
          (cp->val).id = 0;
          cp->ct = cp->cts->tab;
          uVar17 = 0x100;
          goto LAB_0014f097;
        }
        if (uVar14 < 0xfffffffffffffff3) {
          aVar10.i32 = (int32_t)pTVar3->n;
          goto LAB_0014f580;
        }
        if (uVar14 != 0xfffffffffffffff5) {
          lj_err_argtype(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,"type parameter");
        }
        uVar6 = (uint)*(ushort *)(((ulong)dVar4 & 0x7fffffffffff) + 10);
        if (uVar6 == 0x16) {
          (cp->val).id = *(CTypeID *)(((ulong)dVar4 & 0x7fffffffffff) + 0x10);
        }
        else {
          (cp->val).id = uVar6;
        }
        uVar17 = 0x24;
        goto LAB_0014f097;
      case 0x26:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        uVar17 = 0x26;
        if (uVar6 != 0x26) goto LAB_0014f097;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar6 = (uint)*pbVar2;
        cp->c = uVar6;
        uVar17 = 0x105;
        break;
      case 0x2d:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        uVar17 = 0x2d;
        if (uVar6 != 0x3e) goto LAB_0014f097;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar6 = (uint)*pbVar2;
        cp->c = uVar6;
        uVar17 = 0x10c;
        break;
      case 0x2f:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        if (uVar6 == 0x2a) {
          do {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            uVar6 = (uint)bVar5;
            cp->c = (uint)bVar5;
            if (bVar5 == 0x5c) {
              uVar6 = cp_get_bs(cp);
            }
            while (uVar6 == 0x2a) {
              pbVar2 = (byte *)cp->p;
              cp->p = (char *)(pbVar2 + 1);
              bVar5 = *pbVar2;
              uVar6 = (uint)bVar5;
              cp->c = (uint)bVar5;
              if (bVar5 == 0x5c) {
                uVar6 = cp_get_bs(cp);
              }
              if (uVar6 == 0x2f) goto switchD_0014ec75_caseD_20;
              uVar6 = cp->c;
            }
            uVar6 = cp->c;
            if ((uVar6 == 10) || (uVar6 == 0xd)) {
              bVar5 = *cp->p;
              if (((bVar5 == 0xd) || (bVar5 == 10)) && (uVar6 != bVar5)) {
                cp->p = cp->p + 1;
              }
              cp->linenumber = cp->linenumber + 1;
            }
          } while (uVar6 != 0);
          goto LAB_0014ed5c;
        }
        if (cp->c != 0x2f) {
          uVar17 = 0x2f;
          goto LAB_0014f097;
        }
        do {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar6 = (uint)bVar5;
          cp->c = (uint)bVar5;
          if (bVar5 == 0x5c) {
            uVar6 = cp_get_bs(cp);
          }
        } while (((uVar6 != 10) && (uVar6 != 0xd)) && (cp->c != 0));
LAB_0014ed5c:
        lVar15 = (long)cp->c;
        bVar5 = ""[lVar15 + 1];
        if ((char)bVar5 < '\0') goto LAB_0014ee23;
        goto LAB_0014ec2e;
      default:
        if (uVar6 == 0xd) goto LAB_0014ed26;
switchD_0014ec75_caseD_23:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar9 = (uint)*pbVar2;
        cp->c = uVar9;
        uVar17 = uVar6;
        if (uVar9 == 0x5c) {
          cp_get_bs(cp);
        }
        goto LAB_0014f097;
      }
    }
    else if ((int)uVar6 < 0x3e) {
      if (uVar6 == 0x3c) {
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        if (uVar6 != 0x3d) {
          uVar17 = 0x3c;
          if (cp->c == 0x3c) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            uVar6 = (uint)bVar5;
            cp->c = (uint)bVar5;
            uVar17 = 0x10a;
            goto LAB_0014f08e;
          }
          goto LAB_0014f097;
        }
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        uVar17 = 0x108;
      }
      else {
        if (uVar6 != 0x3d) goto switchD_0014ec75_caseD_23;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar6 = cp_get_bs(cp);
        }
        uVar17 = 0x3d;
        if (uVar6 != 0x3d) goto LAB_0014f097;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        uVar17 = 0x106;
      }
    }
    else if (uVar6 == 0x3e) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar6 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar6 = cp_get_bs(cp);
      }
      if (uVar6 == 0x3d) {
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        uVar17 = 0x109;
      }
      else {
        uVar17 = 0x3e;
        if (cp->c != 0x3e) goto LAB_0014f097;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar6 = (uint)bVar5;
        cp->c = (uint)bVar5;
        uVar17 = 0x10b;
      }
    }
    else {
      if (uVar6 != 0x7c) goto switchD_0014ec75_caseD_23;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar6 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar6 = cp_get_bs(cp);
      }
      uVar17 = 0x7c;
      if (uVar6 != 0x7c) goto LAB_0014f097;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar6 = (uint)bVar5;
      cp->c = (uint)bVar5;
      uVar17 = 0x104;
    }
LAB_0014f08e:
    if (uVar6 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_0014f097;
  }
LAB_0014ee23:
  if ((bVar5 & 8) == 0) {
    do {
      CVar1 = cp->c;
      pcVar11 = (cp->sb).w;
      if (*(int *)&(cp->sb).e == (int)pcVar11) {
        pcVar11 = lj_buf_more2(sb,1);
      }
      *pcVar11 = (char)CVar1;
      (cp->sb).w = pcVar11 + 1;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar6 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar6 = cp_get_bs(cp);
      }
    } while ((char)""[(long)(int)uVar6 + 1] < '\0');
    pcVar11 = (cp->sb).b;
    pGVar12 = lj_str_new(cp->L,pcVar11,(ulong)(uint)(*(int *)&(cp->sb).w - (int)pcVar11));
    cp->str = pGVar12;
    CVar7 = lj_ctype_getname(cp->cts,&cp->ct,pGVar12,cp->tmask);
    (cp->val).id = CVar7;
    uVar6 = cp->ct->info;
    uVar17 = 0x100;
    if ((uVar6 & 0xf0000000) == 0xd0000000) {
      uVar17 = uVar6 & 0xffff;
    }
    goto LAB_0014f097;
  }
  do {
    CVar1 = cp->c;
    pcVar11 = (cp->sb).w;
    if (*(int *)&(cp->sb).e == (int)pcVar11) {
      pcVar11 = lj_buf_more2(sb,1);
    }
    *pcVar11 = (char)CVar1;
    (cp->sb).w = pcVar11 + 1;
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar6 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar6 = cp_get_bs(cp);
    }
  } while ((char)""[(long)(int)uVar6 + 1] < '\0');
  pcVar11 = (cp->sb).w;
  if (*(int *)&(cp->sb).e == (int)pcVar11) {
    pcVar11 = lj_buf_more2(sb,1);
  }
  *pcVar11 = '\0';
  (cp->sb).w = pcVar11 + 1;
  p = (uint8_t *)(cp->sb).b;
  SVar8 = lj_strscan_scan(p,~(uint)p + (int)(pcVar11 + 1),&local_38,0x10);
  if (SVar8 == STRSCAN_INT) {
    CVar7 = 9;
LAB_0014f02f:
    (cp->val).id = CVar7;
  }
  else {
    if (SVar8 == STRSCAN_U32) {
      CVar7 = 10;
      goto LAB_0014f02f;
    }
    if ((cp->mode & 0x20) == 0) {
      uVar6 = 0x102;
      em = LJ_ERR_XNUMBER;
LAB_0014f698:
      cp_errmsg(cp,uVar6,em);
    }
  }
  (cp->val).field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)local_38.field_4.i;
LAB_0014f045:
  uVar17 = 0x102;
LAB_0014f097:
  cp->tok = uVar17;
  return uVar17;
joined_r0x0014f0f4:
  if (uVar17 == uVar6) goto LAB_0014f0fa;
  if (uVar17 != 0x5c) {
    if (uVar17 != 0) goto LAB_0014f234;
LAB_0014f68b:
    uVar6 = 0x103;
    em = LJ_ERR_XSTR;
    goto LAB_0014f698;
  }
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar17 = (uint)*pbVar2;
  cp->c = uVar17;
  if (uVar17 == 0x5c) {
    uVar17 = cp_get_bs(cp);
  }
  switch(uVar17) {
  case 0x6e:
    uVar17 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    goto switchD_0014f2a0_caseD_6f;
  case 0x72:
    uVar17 = 0xd;
    break;
  case 0x74:
    uVar17 = 9;
    break;
  case 0x76:
    uVar17 = 0xb;
    break;
  case 0x78:
    iVar18 = 0;
    while( true ) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar17 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar17 = cp_get_bs(cp);
      }
      if ((""[(long)(int)uVar17 + 1] & 0x10) == 0) break;
      uVar17 = cp->c;
      iVar13 = (uVar17 & 0xf) + 9;
      if ((""[(long)(int)uVar17 + 1] & 8) != 0) {
        iVar13 = uVar17 - 0x30;
      }
      iVar18 = iVar18 * 0x10 + iVar13;
    }
    pcVar11 = (cp->sb).w;
    if (*(int *)&(cp->sb).e == (int)pcVar11) {
      pcVar11 = lj_buf_more2(sb,1);
    }
    *pcVar11 = (char)iVar18;
    goto LAB_0014f414;
  default:
    switch(uVar17) {
    case 0x61:
      uVar17 = 7;
      break;
    case 0x62:
      uVar17 = 8;
      break;
    case 99:
    case 100:
      goto switchD_0014f2a0_caseD_6f;
    case 0x65:
      uVar17 = 0x1b;
      break;
    case 0x66:
      uVar17 = 0xc;
      break;
    default:
      if (uVar17 == 0) goto LAB_0014f68b;
switchD_0014f2a0_caseD_6f:
      if ((""[(long)(int)uVar17 + 1] & 8) == 0) break;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar9 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar9 = cp_get_bs(cp);
      }
      cVar16 = (char)uVar17 + -0x30;
      if ((""[(long)(int)uVar9 + 1] & 8) != 0) {
        CVar1 = cp->c;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar17 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar17 = cp_get_bs(cp);
        }
        cVar16 = (char)CVar1 + cVar16 * '\b' + -0x30;
        if ((""[(long)(int)uVar17 + 1] & 8) != 0) {
          cVar16 = (char)cp->c + cVar16 * '\b' + -0x30;
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          uVar17 = (uint)*pbVar2;
          cp->c = uVar17;
          if (uVar17 == 0x5c) {
            cp_get_bs(cp);
          }
        }
      }
      pcVar11 = (cp->sb).w;
      if (*(int *)&(cp->sb).e == (int)pcVar11) {
        pcVar11 = lj_buf_more2(sb,1);
      }
      *pcVar11 = cVar16;
LAB_0014f414:
      sb->w = pcVar11 + 1;
      goto LAB_0014f265;
    }
  }
LAB_0014f234:
  pcVar11 = (cp->sb).w;
  if (*(int *)&(cp->sb).e == (int)pcVar11) {
    pcVar11 = lj_buf_more2(sb,1);
  }
  *pcVar11 = (char)uVar17;
  (cp->sb).w = pcVar11 + 1;
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar17 = (uint)*pbVar2;
  cp->c = uVar17;
  if (uVar17 == 0x5c) {
    cp_get_bs(cp);
  }
LAB_0014f265:
  uVar17 = cp->c;
  goto joined_r0x0014f0f4;
LAB_0014f0fa:
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar17 = (uint)*pbVar2;
  cp->c = uVar17;
  if (uVar17 == 0x5c) {
    cp_get_bs(cp);
  }
  if (uVar6 == 0x22) {
    pcVar11 = (cp->sb).b;
    pGVar12 = lj_str_new(cp->L,pcVar11,(ulong)(uint)(*(int *)&(cp->sb).w - (int)pcVar11));
    cp->str = pGVar12;
    uVar17 = 0x101;
    goto LAB_0014f097;
  }
  pcVar11 = (cp->sb).b;
  if (*(int *)&(cp->sb).w - (int)pcVar11 != 1) {
    cp_err_token(cp,0x27);
  }
  aVar10 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(int)*pcVar11;
LAB_0014f580:
  (cp->val).field_0 = aVar10;
  (cp->val).id = 9;
  goto LAB_0014f045;
}

Assistant:

static LJ_NOINLINE CPToken cp_next(CPState *cp)
{
  return (cp->tok = cp_next_(cp));
}